

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

FT_Error t1_allocate_blend(T1_Face face,FT_UInt num_designs,FT_UInt num_axis)

{
  FT_Memory memory;
  PS_Blend pPVar1;
  PS_FontInfo pPVar2;
  PS_Private pPVar3;
  FT_BBox *pFVar4;
  ulong uVar5;
  long lVar6;
  FT_Error error;
  FT_Error local_3c;
  ulong local_38;
  
  memory = (face->root).memory;
  local_3c = 0;
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    pPVar1 = (PS_Blend)ft_mem_alloc(memory,0x300,&local_3c);
    if (local_3c != 0) {
      return local_3c;
    }
    pPVar1->num_default_design_vector = 0;
    pPVar1->design_pos[0] = (FT_Fixed *)0x0;
    pPVar1->weight_vector = (FT_Fixed *)0x0;
    pPVar1->default_weight_vector = (FT_Fixed *)0x0;
    face->blend = pPVar1;
  }
  if (num_designs != 0) {
    if (pPVar1->num_designs == 0) {
      local_38 = (ulong)num_designs;
      pPVar2 = (PS_FontInfo)ft_mem_realloc(memory,0x38,0,local_38,(void *)0x0,&local_3c);
      pPVar1->font_infos[1] = pPVar2;
      if (local_3c != 0) {
        return local_3c;
      }
      pPVar3 = (PS_Private)ft_mem_realloc(memory,0xe0,0,local_38,(void *)0x0,&local_3c);
      pPVar1->privates[1] = pPVar3;
      if (local_3c != 0) {
        return local_3c;
      }
      pFVar4 = (FT_BBox *)ft_mem_realloc(memory,0x20,0,local_38,(void *)0x0,&local_3c);
      pPVar1->bboxes[1] = pFVar4;
      if (local_3c != 0) {
        return local_3c;
      }
      pPVar1->font_infos[0] = &(face->type1).font_info;
      pPVar1->privates[0] = &(face->type1).private_dict;
      pPVar1->bboxes[0] = &(face->type1).font_bbox;
      if (num_designs != 1) {
        uVar5 = 3;
        if (3 < num_designs + 1) {
          uVar5 = (ulong)(num_designs + 1);
        }
        pPVar2 = pPVar1->font_infos[1];
        pPVar3 = pPVar1->privates[1];
        lVar6 = 0;
        do {
          pPVar3 = pPVar3 + 1;
          pPVar2 = pPVar2 + 1;
          pFVar4 = pFVar4 + 1;
          pPVar1->font_infos[lVar6 + 2] = pPVar2;
          pPVar1->privates[lVar6 + 2] = pPVar3;
          pPVar1->bboxes[lVar6 + 2] = pFVar4;
          lVar6 = lVar6 + 1;
        } while (uVar5 - 2 != lVar6);
      }
      pPVar1->num_designs = num_designs;
    }
    else if (pPVar1->num_designs != num_designs) {
      return 3;
    }
  }
  if (num_axis == 0) {
    return local_3c;
  }
  if (pPVar1->num_axis != 0 && pPVar1->num_axis != num_axis) {
    return 3;
  }
  pPVar1->num_axis = num_axis;
  return local_3c;
}

Assistant:

static FT_Error
  t1_allocate_blend( T1_Face  face,
                     FT_UInt  num_designs,
                     FT_UInt  num_axis )
  {
    PS_Blend   blend;
    FT_Memory  memory = face->root.memory;
    FT_Error   error  = FT_Err_Ok;


    blend = face->blend;
    if ( !blend )
    {
      if ( FT_NEW( blend ) )
        goto Exit;

      blend->num_default_design_vector = 0;
      blend->weight_vector             = NULL;
      blend->default_weight_vector     = NULL;
      blend->design_pos[0]             = NULL;

      face->blend = blend;
    }

    /* allocate design data if needed */
    if ( num_designs > 0 )
    {
      if ( blend->num_designs == 0 )
      {
        FT_UInt  nn;


        /* allocate the blend `private' and `font_info' dictionaries */
        if ( FT_NEW_ARRAY( blend->font_infos[1], num_designs ) ||
             FT_NEW_ARRAY( blend->privates  [1], num_designs ) ||
             FT_NEW_ARRAY( blend->bboxes    [1], num_designs ) )
          goto Exit;

        blend->font_infos[0] = &face->type1.font_info;
        blend->privates  [0] = &face->type1.private_dict;
        blend->bboxes    [0] = &face->type1.font_bbox;

        for ( nn = 2; nn <= num_designs; nn++ )
        {
          blend->font_infos[nn] = blend->font_infos[nn - 1] + 1;
          blend->privates  [nn] = blend->privates  [nn - 1] + 1;
          blend->bboxes    [nn] = blend->bboxes    [nn - 1] + 1;
        }

        blend->num_designs = num_designs;
      }
      else if ( blend->num_designs != num_designs )
        goto Fail;
    }

    /* allocate axis data if needed */
    if ( num_axis > 0 )
    {
      if ( blend->num_axis != 0 && blend->num_axis != num_axis )
        goto Fail;

      blend->num_axis = num_axis;
    }

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }